

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix-test.c++
# Opt level: O1

void __thiscall kj::anon_unknown_0::TestCase68::run(TestCase68 *this)

{
  StringPtr *pSVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  Disposer *pDVar4;
  HttpHeaderTable *this_00;
  int iVar5;
  HttpHeaderId *pHVar6;
  HttpHeaderId *extraout_RDX;
  HttpHeaderId *extraout_RDX_00;
  HttpHeaderId *extraout_RDX_01;
  HttpHeaderId *extraout_RDX_02;
  HttpHeaderId *extraout_RDX_03;
  HttpHeaderId *extraout_RDX_04;
  HttpHeaderId *extraout_RDX_05;
  HttpHeaderId *extraout_RDX_06;
  HttpHeaderId *extraout_RDX_07;
  HttpHeaderId *extraout_RDX_08;
  HttpHeaderId *extraout_RDX_09;
  HttpHeaderId *extraout_RDX_10;
  HttpHeaderId *extraout_RDX_11;
  HttpHeaderId *extraout_RDX_12;
  HttpHeaderId *extraout_RDX_13;
  HttpHeaderId *extraout_RDX_14;
  HttpHeaderId *extraout_RDX_15;
  HttpHeaderId *extraout_RDX_16;
  HttpHeaderId *extraout_RDX_17;
  HttpHeaderId *extraout_RDX_18;
  HttpHeaderId *extraout_RDX_19;
  HttpHeaderId *extraout_RDX_20;
  HttpHeaderId *extraout_RDX_21;
  HttpHeaderId *extraout_RDX_22;
  HttpHeaderTable *ptrCopy;
  bool bVar7;
  HttpHeaderId HVar8;
  StringPtr name;
  StringPtr name_00;
  StringPtr name_01;
  StringPtr name_02;
  StringPtr name_03;
  StringPtr name_04;
  StringPtr name_05;
  StringPtr name_06;
  StringPtr name_07;
  StringPtr name_08;
  StringPtr name_09;
  Builder builder;
  undefined1 local_a8 [32];
  Fault local_88;
  Builder local_80;
  HttpHeaderTable *local_70;
  uint local_68;
  HttpHeaderTable *local_60;
  uint local_58;
  HttpHeaderTable *local_50;
  uint local_48;
  HttpHeaderTable *local_40;
  uint local_38;
  
  HttpHeaderTable::Builder::Builder(&local_80);
  name.content.size_ = 5;
  name.content.ptr = "Host";
  HVar8 = HttpHeaderTable::Builder::add(&local_80,name);
  local_60 = HVar8.table;
  local_58 = HVar8.id;
  name_00.content.size_ = 5;
  name_00.content.ptr = "hOsT";
  HVar8 = HttpHeaderTable::Builder::add(&local_80,name_00);
  local_40 = HVar8.table;
  local_38 = HVar8.id;
  name_01.content.size_ = 8;
  name_01.content.ptr = "Foo-Bar";
  HVar8 = HttpHeaderTable::Builder::add(&local_80,name_01);
  local_70 = HVar8.table;
  local_68 = HVar8.id;
  name_02.content.size_ = 8;
  name_02.content.ptr = "baz-qux";
  HVar8 = HttpHeaderTable::Builder::add(&local_80,name_02);
  local_50 = HVar8.table;
  local_48 = HVar8.id;
  name_03.content.size_ = 8;
  name_03.content.ptr = "Baz-Qux";
  HVar8 = HttpHeaderTable::Builder::add(&local_80,name_03);
  this_00 = local_80.table.ptr;
  pDVar4 = local_80.table.disposer;
  pHVar6 = HVar8._8_8_;
  local_80.table.ptr = (HttpHeaderTable *)0x0;
  if ((((long)(this_00->namesById).builder.pos - (long)(this_00->namesById).builder.ptr &
       0xffffffff0U) != 0x110) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[60]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x54,ERROR,"\"failed: expected \" \"table->idCount() == builtinHeaderCount + 2\"",
               (char (*) [60])"failed: expected table->idCount() == builtinHeaderCount + 2");
    pHVar6 = extraout_RDX;
  }
  if ((local_58 != 0xb) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[44]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x56,ERROR,"\"failed: expected \" \"host == HttpHeaderId::HOST\"",
               (char (*) [44])"failed: expected host == HttpHeaderId::HOST");
    pHVar6 = extraout_RDX_00;
  }
  if ((local_58 == 0xc) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[44]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x57,ERROR,"\"failed: expected \" \"host != HttpHeaderId::DATE\"",
               (char (*) [44])"failed: expected host != HttpHeaderId::DATE");
    pHVar6 = extraout_RDX_01;
  }
  if ((local_38 != local_58) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[31]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x58,ERROR,"\"failed: expected \" \"host2 == host\"",
               (char (*) [31])"failed: expected host2 == host");
    pHVar6 = extraout_RDX_02;
  }
  if ((local_58 == local_68) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[32]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x5a,ERROR,"\"failed: expected \" \"host != fooBar\"",
               (char (*) [32])"failed: expected host != fooBar");
    pHVar6 = extraout_RDX_03;
  }
  if ((local_58 == local_48) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[32]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x5b,ERROR,"\"failed: expected \" \"host != bazQux\"",
               (char (*) [32])"failed: expected host != bazQux");
    pHVar6 = extraout_RDX_04;
  }
  if ((local_68 == local_48) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[34]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x5c,ERROR,"\"failed: expected \" \"fooBar != bazQux\"",
               (char (*) [34])"failed: expected fooBar != bazQux");
    pHVar6 = extraout_RDX_05;
  }
  if ((local_48 != HVar8.id) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[35]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x5d,ERROR,"\"failed: expected \" \"bazQux == bazQux2\"",
               (char (*) [35])"failed: expected bazQux == bazQux2");
    pHVar6 = extraout_RDX_06;
  }
  str<kj::HttpHeaderId&>((String *)local_a8,(kj *)&local_60,pHVar6);
  uVar3 = local_a8._8_8_;
  bVar7 = true;
  pHVar6 = extraout_RDX_07;
  if ((HttpHeaderTable *)local_a8._8_8_ == (HttpHeaderTable *)0x5) {
    iVar5 = bcmp((void *)local_a8._0_8_,"Host",4);
    bVar7 = iVar5 != 0;
    pHVar6 = extraout_RDX_08;
  }
  uVar2 = local_a8._0_8_;
  if ((char *)local_a8._0_8_ != (char *)0x0) {
    local_a8._0_8_ = (char *)0x0;
    local_a8._8_8_ = (HttpHeaderTable *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_a8._20_4_,local_a8._16_4_))
              ((undefined8 *)CONCAT44(local_a8._20_4_,local_a8._16_4_),uVar2,1,uVar3,uVar3,0);
    pHVar6 = extraout_RDX_09;
  }
  if ((bool)(bVar7 & _::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[41]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x5f,ERROR,"\"failed: expected \" \"kj::str(host) == \\\"Host\\\"\"",
               (char (*) [41])"failed: expected kj::str(host) == \"Host\"");
    pHVar6 = extraout_RDX_10;
  }
  str<kj::HttpHeaderId&>((String *)local_a8,(kj *)&local_40,pHVar6);
  uVar3 = local_a8._8_8_;
  bVar7 = true;
  pHVar6 = extraout_RDX_11;
  if ((HttpHeaderTable *)local_a8._8_8_ == (HttpHeaderTable *)0x5) {
    iVar5 = bcmp((void *)local_a8._0_8_,"Host",4);
    bVar7 = iVar5 != 0;
    pHVar6 = extraout_RDX_12;
  }
  uVar2 = local_a8._0_8_;
  if ((char *)local_a8._0_8_ != (char *)0x0) {
    local_a8._0_8_ = (char *)0x0;
    local_a8._8_8_ = (HttpHeaderTable *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_a8._20_4_,local_a8._16_4_))
              ((undefined8 *)CONCAT44(local_a8._20_4_,local_a8._16_4_),uVar2,1,uVar3,uVar3,0);
    pHVar6 = extraout_RDX_13;
  }
  if ((bool)(bVar7 & _::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[42]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x60,ERROR,"\"failed: expected \" \"kj::str(host2) == \\\"Host\\\"\"",
               (char (*) [42])"failed: expected kj::str(host2) == \"Host\"");
    pHVar6 = extraout_RDX_14;
  }
  str<kj::HttpHeaderId&>((String *)local_a8,(kj *)&local_70,pHVar6);
  uVar3 = local_a8._8_8_;
  bVar7 = true;
  pHVar6 = extraout_RDX_15;
  if ((HttpHeaderTable *)local_a8._8_8_ == (HttpHeaderTable *)&DAT_00000008) {
    iVar5 = bcmp((void *)local_a8._0_8_,"Foo-Bar",7);
    bVar7 = iVar5 != 0;
    pHVar6 = extraout_RDX_16;
  }
  uVar2 = local_a8._0_8_;
  if ((char *)local_a8._0_8_ != (char *)0x0) {
    local_a8._0_8_ = (char *)0x0;
    local_a8._8_8_ = (HttpHeaderTable *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_a8._20_4_,local_a8._16_4_))
              ((undefined8 *)CONCAT44(local_a8._20_4_,local_a8._16_4_),uVar2,1,uVar3,uVar3,0);
    pHVar6 = extraout_RDX_17;
  }
  if ((bool)(bVar7 & _::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[46]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x61,ERROR,"\"failed: expected \" \"kj::str(fooBar) == \\\"Foo-Bar\\\"\"",
               (char (*) [46])"failed: expected kj::str(fooBar) == \"Foo-Bar\"");
    pHVar6 = extraout_RDX_18;
  }
  str<kj::HttpHeaderId&>((String *)local_a8,(kj *)&local_50,pHVar6);
  uVar3 = local_a8._8_8_;
  bVar7 = true;
  pHVar6 = extraout_RDX_19;
  if ((HttpHeaderTable *)local_a8._8_8_ == (HttpHeaderTable *)&DAT_00000008) {
    iVar5 = bcmp((void *)local_a8._0_8_,"baz-qux",7);
    bVar7 = iVar5 != 0;
    pHVar6 = extraout_RDX_20;
  }
  uVar2 = local_a8._0_8_;
  if ((char *)local_a8._0_8_ != (char *)0x0) {
    local_a8._0_8_ = (char *)0x0;
    local_a8._8_8_ = (HttpHeaderTable *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_a8._20_4_,local_a8._16_4_))
              ((undefined8 *)CONCAT44(local_a8._20_4_,local_a8._16_4_),uVar2,1,uVar3,uVar3,0);
    pHVar6 = extraout_RDX_21;
  }
  if ((bool)(bVar7 & _::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[46]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x62,ERROR,"\"failed: expected \" \"kj::str(bazQux) == \\\"baz-qux\\\"\"",
               (char (*) [46])"failed: expected kj::str(bazQux) == \"baz-qux\"");
    pHVar6 = extraout_RDX_22;
  }
  str<kj::HttpHeaderId_const&>((String *)local_a8,(kj *)&HttpHeaderId::HOST,pHVar6);
  uVar3 = local_a8._8_8_;
  bVar7 = true;
  if ((HttpHeaderTable *)local_a8._8_8_ == (HttpHeaderTable *)0x5) {
    iVar5 = bcmp((void *)local_a8._0_8_,"Host",4);
    bVar7 = iVar5 != 0;
  }
  uVar2 = local_a8._0_8_;
  if ((char *)local_a8._0_8_ != (char *)0x0) {
    local_a8._0_8_ = (char *)0x0;
    local_a8._8_8_ = (HttpHeaderTable *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_a8._20_4_,local_a8._16_4_))
              ((undefined8 *)CONCAT44(local_a8._20_4_,local_a8._16_4_),uVar2,1,uVar3,uVar3,0);
  }
  if ((bool)(bVar7 & _::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[55]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,99,ERROR,"\"failed: expected \" \"kj::str(HttpHeaderId::HOST) == \\\"Host\\\"\"",
               (char (*) [55])"failed: expected kj::str(HttpHeaderId::HOST) == \"Host\"");
  }
  pSVar1 = (this_00->namesById).builder.ptr;
  if (((pSVar1[0xc].content.size_ != 5) ||
      (iVar5 = bcmp(pSVar1[0xc].content.ptr,"Date",4), iVar5 != 0)) && (_::Debug::minSeverity < 3))
  {
    _::Debug::log<char_const(&)[65]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x65,ERROR,
               "\"failed: expected \" \"table->idToString(HttpHeaderId::DATE) == \\\"Date\\\"\"",
               (char (*) [65])"failed: expected table->idToString(HttpHeaderId::DATE) == \"Date\"");
  }
  pSVar1 = (this_00->namesById).builder.ptr;
  if (((pSVar1[local_68].content.size_ != 8) ||
      (iVar5 = bcmp(pSVar1[local_68].content.ptr,"Foo-Bar",7), iVar5 != 0)) &&
     (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[56]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x66,ERROR,"\"failed: expected \" \"table->idToString(fooBar) == \\\"Foo-Bar\\\"\"",
               (char (*) [56])"failed: expected table->idToString(fooBar) == \"Foo-Bar\"");
  }
  name_04.content.size_ = 5;
  name_04.content.ptr = "Date";
  HttpHeaderTable::stringToId((Maybe<kj::HttpHeaderId> *)local_a8,this_00,name_04);
  if (local_a8[0] != true) {
    local_88.exception = (Exception *)0x0;
    local_a8._0_8_ = (char *)0x0;
    local_a8._8_8_ = (HttpHeaderTable *)0x0;
    _::Debug::Fault::init
              (&local_88,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
              );
    _::Debug::Fault::fatal(&local_88);
  }
  if ((local_a8._16_4_ != 0xc) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[84]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x68,ERROR,
               "\"failed: expected \" \"KJ_ASSERT_NONNULL(table->stringToId(\\\"Date\\\")) == HttpHeaderId::DATE\""
               ,(char (*) [84])
                "failed: expected KJ_ASSERT_NONNULL(table->stringToId(\"Date\")) == HttpHeaderId::DATE"
              );
  }
  name_05.content.size_ = 5;
  name_05.content.ptr = "dATE";
  HttpHeaderTable::stringToId((Maybe<kj::HttpHeaderId> *)local_a8,this_00,name_05);
  if (local_a8[0] != true) {
    local_88.exception = (Exception *)0x0;
    local_a8._0_8_ = (char *)0x0;
    local_a8._8_8_ = (HttpHeaderTable *)0x0;
    _::Debug::Fault::init
              (&local_88,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
              );
    _::Debug::Fault::fatal(&local_88);
  }
  if ((local_a8._16_4_ != 0xc) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[84]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x69,ERROR,
               "\"failed: expected \" \"KJ_ASSERT_NONNULL(table->stringToId(\\\"dATE\\\")) == HttpHeaderId::DATE\""
               ,(char (*) [84])
                "failed: expected KJ_ASSERT_NONNULL(table->stringToId(\"dATE\")) == HttpHeaderId::DATE"
              );
  }
  name_06.content.size_ = 8;
  name_06.content.ptr = "Foo-Bar";
  HttpHeaderTable::stringToId((Maybe<kj::HttpHeaderId> *)local_a8,this_00,name_06);
  if (local_a8[0] != true) {
    local_88.exception = (Exception *)0x0;
    local_a8._0_8_ = (char *)0x0;
    local_a8._8_8_ = (HttpHeaderTable *)0x0;
    _::Debug::Fault::init
              (&local_88,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
              );
    _::Debug::Fault::fatal(&local_88);
  }
  if ((local_a8._16_4_ != local_68) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[75]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x6a,ERROR,
               "\"failed: expected \" \"KJ_ASSERT_NONNULL(table->stringToId(\\\"Foo-Bar\\\")) == fooBar\""
               ,(char (*) [75])
                "failed: expected KJ_ASSERT_NONNULL(table->stringToId(\"Foo-Bar\")) == fooBar");
  }
  name_07.content.size_ = 8;
  name_07.content.ptr = "foo-BAR";
  HttpHeaderTable::stringToId((Maybe<kj::HttpHeaderId> *)local_a8,this_00,name_07);
  if (local_a8[0] != true) {
    local_88.exception = (Exception *)0x0;
    local_a8._0_8_ = (char *)0x0;
    local_a8._8_8_ = (HttpHeaderTable *)0x0;
    _::Debug::Fault::init
              (&local_88,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
              );
    _::Debug::Fault::fatal(&local_88);
  }
  if ((local_a8._16_4_ != local_68) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[75]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x6b,ERROR,
               "\"failed: expected \" \"KJ_ASSERT_NONNULL(table->stringToId(\\\"foo-BAR\\\")) == fooBar\""
               ,(char (*) [75])
                "failed: expected KJ_ASSERT_NONNULL(table->stringToId(\"foo-BAR\")) == fooBar");
  }
  name_08.content.size_ = 7;
  name_08.content.ptr = "foobar";
  HttpHeaderTable::stringToId((Maybe<kj::HttpHeaderId> *)local_a8,this_00,name_08);
  if ((local_a8[0] == true) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[56]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x6c,ERROR,"\"failed: expected \" \"table->stringToId(\\\"foobar\\\") == nullptr\"",
               (char (*) [56])"failed: expected table->stringToId(\"foobar\") == nullptr");
  }
  name_09.content.size_ = 7;
  name_09.content.ptr = "barfoo";
  HttpHeaderTable::stringToId((Maybe<kj::HttpHeaderId> *)local_a8,this_00,name_09);
  if ((local_a8[0] == true) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[56]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x6d,ERROR,"\"failed: expected \" \"table->stringToId(\\\"barfoo\\\") == nullptr\"",
               (char (*) [56])"failed: expected table->stringToId(\"barfoo\") == nullptr");
  }
  (**pDVar4->_vptr_Disposer)(pDVar4,this_00);
  if (local_80.table.ptr != (HttpHeaderTable *)0x0) {
    local_80.table.ptr = (HttpHeaderTable *)0x0;
    (**(local_80.table.disposer)->_vptr_Disposer)();
  }
  return;
}

Assistant:

TEST(AsyncUnixTest, Signals) {
  captureSignals();
  UnixEventPort port;
  EventLoop loop(port);
  WaitScope waitScope(loop);

  kill(getpid(), SIGURG);

  siginfo_t info = port.onSignal(SIGURG).wait(waitScope);
  EXPECT_EQ(SIGURG, info.si_signo);
  EXPECT_SI_CODE(SI_USER, info.si_code);
}